

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O0

void __thiscall
chaiscript::dispatch::Attribute_Access<const_int_*,_TestBaseType>::~Attribute_Access
          (Attribute_Access<const_int_*,_TestBaseType> *this)

{
  Attribute_Access<const_int_*,_TestBaseType> *this_local;
  
  ~Attribute_Access(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

explicit Attribute_Access(T Class::*t_attr)
          : Proxy_Function_Base(param_types(), 1)
          , m_attr(t_attr) {
      }